

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_hash_finish(psa_hash_operation_t *operation,uint8_t *hash,size_t hash_size,size_t *hash_length)

{
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  size_t actual_hash_length;
  int ret;
  psa_status_t status;
  size_t *hash_length_local;
  size_t hash_size_local;
  uint8_t *hash_local;
  psa_hash_operation_t *operation_local;
  
  if ((operation->alg & 0xff | 0x1000000) == 0x1000001) {
    local_44 = 0x10;
  }
  else {
    if ((operation->alg & 0xff | 0x1000000) == 0x1000002) {
      local_48 = 0x10;
    }
    else {
      if ((operation->alg & 0xff | 0x1000000) == 0x1000003) {
        local_4c = 0x10;
      }
      else {
        if ((operation->alg & 0xff | 0x1000000) == 0x1000004) {
          local_50 = 0x14;
        }
        else {
          if ((operation->alg & 0xff | 0x1000000) == 0x1000005) {
            local_54 = 0x14;
          }
          else {
            if ((operation->alg & 0xff | 0x1000000) == 0x1000008) {
              local_58 = 0x1c;
            }
            else {
              if ((operation->alg & 0xff | 0x1000000) == 0x1000009) {
                local_5c = 0x20;
              }
              else {
                if ((operation->alg & 0xff | 0x1000000) == 0x100000a) {
                  local_60 = 0x30;
                }
                else {
                  if ((operation->alg & 0xff | 0x1000000) == 0x100000b) {
                    local_64 = 0x40;
                  }
                  else {
                    if ((operation->alg & 0xff | 0x1000000) == 0x100000c) {
                      local_68 = 0x1c;
                    }
                    else {
                      if ((operation->alg & 0xff | 0x1000000) == 0x100000d) {
                        local_6c = 0x20;
                      }
                      else {
                        if ((operation->alg & 0xff | 0x1000000) == 0x1000010) {
                          local_70 = 0x1c;
                        }
                        else {
                          if ((operation->alg & 0xff | 0x1000000) == 0x1000011) {
                            local_74 = 0x20;
                          }
                          else {
                            if ((operation->alg & 0xff | 0x1000000) == 0x1000012) {
                              local_78 = 0x30;
                            }
                            else {
                              local_78 = 0;
                              if ((operation->alg & 0xff | 0x1000000) == 0x1000013) {
                                local_78 = 0x40;
                              }
                            }
                            local_74 = local_78;
                          }
                          local_70 = local_74;
                        }
                        local_6c = local_70;
                      }
                      local_68 = local_6c;
                    }
                    local_64 = local_68;
                  }
                  local_60 = local_64;
                }
                local_5c = local_60;
              }
              local_58 = local_5c;
            }
            local_54 = local_58;
          }
          local_50 = local_54;
        }
        local_4c = local_50;
      }
      local_48 = local_4c;
    }
    local_44 = local_48;
  }
  *hash_length = hash_size;
  if (hash_size != 0) {
    memset(hash,0x21,hash_size);
  }
  if (hash_size < (ulong)(long)local_44) {
    actual_hash_length._4_4_ = -0x8a;
  }
  else {
    switch(operation->alg) {
    case 0x1000003:
      actual_hash_length._0_4_ = mbedtls_md5_finish_ret(&(operation->ctx).md5,hash);
      break;
    case 0x1000004:
      actual_hash_length._0_4_ = mbedtls_ripemd160_finish_ret(&(operation->ctx).ripemd160,hash);
      break;
    case 0x1000005:
      actual_hash_length._0_4_ = mbedtls_sha1_finish_ret(&(operation->ctx).sha1,hash);
      break;
    default:
      return -0x89;
    case 0x1000008:
    case 0x1000009:
      actual_hash_length._0_4_ = mbedtls_sha256_finish_ret(&(operation->ctx).sha256,hash);
      break;
    case 0x100000a:
    case 0x100000b:
      actual_hash_length._0_4_ = mbedtls_sha512_finish_ret(&(operation->ctx).sha512,hash);
    }
    actual_hash_length._4_4_ = mbedtls_to_psa_error((int)actual_hash_length);
  }
  if (actual_hash_length._4_4_ == 0) {
    *hash_length = (long)local_44;
    operation_local._4_4_ = psa_hash_abort(operation);
  }
  else {
    psa_hash_abort(operation);
    operation_local._4_4_ = actual_hash_length._4_4_;
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_hash_finish( psa_hash_operation_t *operation,
                              uint8_t *hash,
                              size_t hash_size,
                              size_t *hash_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t actual_hash_length = PSA_HASH_SIZE( operation->alg );

    /* Fill the output buffer with something that isn't a valid hash
     * (barring an attack on the hash and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    *hash_length = hash_size;
    /* If hash_size is 0 then hash may be NULL and then the
     * call to memset would have undefined behavior. */
    if( hash_size != 0 )
        memset( hash, '!', hash_size );

    if( hash_size < actual_hash_length )
    {
        status = PSA_ERROR_BUFFER_TOO_SMALL;
        goto exit;
    }

    switch( operation->alg )
    {
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            ret = mbedtls_md2_finish_ret( &operation->ctx.md2, hash );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            ret = mbedtls_md4_finish_ret( &operation->ctx.md4, hash );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            ret = mbedtls_md5_finish_ret( &operation->ctx.md5, hash );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            ret = mbedtls_ripemd160_finish_ret( &operation->ctx.ripemd160, hash );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            ret = mbedtls_sha1_finish_ret( &operation->ctx.sha1, hash );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            ret = mbedtls_sha256_finish_ret( &operation->ctx.sha256, hash );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            ret = mbedtls_sha512_finish_ret( &operation->ctx.sha512, hash );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }
    status = mbedtls_to_psa_error( ret );

exit:
    if( status == PSA_SUCCESS )
    {
        *hash_length = actual_hash_length;
        return( psa_hash_abort( operation ) );
    }
    else
    {
        psa_hash_abort( operation );
        return( status );
    }
}